

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

bool __thiscall IMLE::validInverseSolutions(IMLE *this,int *newSol1,int *newSol2,int *worseSol)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  bool bVar4;
  Scalar SVar5;
  Z *pZVar6;
  Scalar SVar7;
  int *piVar8;
  double *val;
  char *pmessage;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *in_R8;
  longdouble *in_R9;
  double *pdVar9;
  Index othersize;
  long lVar10;
  long lVar11;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar12;
  longdouble in_ST5;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  Vec T;
  Z aux;
  Vec sumWsq;
  scalar_sum_op<double,_double> local_169;
  longdouble local_168;
  double local_158;
  int *local_150;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_148;
  plainobjectbase_evaluator_data<double,_0> local_138;
  long lStack_130;
  longdouble local_128;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_118;
  int *local_100;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  local_f8;
  undefined1 local_d0 [24];
  variable_if_dynamic<long,__1> local_b8;
  Mat *local_b0;
  scalar_constant_op<double> local_a8;
  variable_if_dynamic<long,__1> local_a0;
  variable_if_dynamic<long,__1> local_98;
  Mat *local_88;
  variable_if_dynamic<long,__1> local_80;
  variable_if_dynamic<long,__1> local_78;
  void *local_70;
  double local_58;
  int *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  lVar10 = (long)this->nInvSolFound;
  local_148.m_storage.m_data = (double *)0x0;
  local_148.m_storage.m_rows = 0;
  local_150 = worseSol;
  local_50 = newSol2;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_148,lVar10,1);
  if (local_148.m_storage.m_rows != lVar10) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_148,lVar10,1);
    lVar10 = local_148.m_storage.m_rows;
  }
  if (0 < lVar10) {
    memset(local_148.m_storage.m_data,0,lVar10 << 3);
  }
  lVar10 = (long)this->nInvSolFound;
  local_118.m_storage.m_data = (double *)0x0;
  local_118.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_118,lVar10,1);
  if (local_118.m_storage.m_rows != lVar10) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_118,lVar10,1);
    lVar10 = local_118.m_storage.m_rows;
  }
  if (0 < lVar10) {
    memset(local_118.m_storage.m_data,0,lVar10 << 3);
  }
  iVar1 = this->M;
  if (0 < (long)iVar1) {
    piVar3 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    in_R8 = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
             *)&(((this->experts).
                  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  .
                  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert).p_x_Norm;
    in_R9 = (longdouble *)0x0;
    do {
      iVar2 = piVar3[(long)in_R9];
      local_148.m_storage.m_data[iVar2] = pdVar9[(long)in_R9] + local_148.m_storage.m_data[iVar2];
      local_118.m_storage.m_data[iVar2] =
           *(double *)in_R8 * *(double *)in_R8 + local_118.m_storage.m_data[iVar2];
      in_R9 = (longdouble *)((long)in_R9 + 1);
      in_R8 = in_R8 + 0x308;
    } while ((longdouble *)(long)iVar1 != in_R9);
  }
  *local_150 = -1;
  local_100 = newSol1;
  if (this->nInvSolFound < 1) {
    local_158 = -1.0;
  }
  else {
    lVar11 = 0;
    local_128 = (longdouble)1.79769313486232e+308;
    lVar10 = 0;
    pdVar9 = (double *)0x0;
    local_158 = -1.0;
    do {
      local_d0._0_8_ =
           (long)&(((this->invPredictions).
                    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
           lVar10;
      local_d0._16_8_ =
           (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows;
      local_d0._8_8_ =
           (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data + local_d0._16_8_ * (long)pdVar9;
      local_a8.m_other = 0.0;
      uVar13 = 0;
      uVar14 = 0;
      lVar12 = in_ST5;
      local_b0 = &this->sumInvRzj;
      local_a0.m_value = (long)pdVar9;
      local_98.m_value = local_d0._16_8_;
      if ((void *)local_d0._16_8_ != (void *)0x0) {
        local_f8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (((Z *)local_d0._0_8_)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             .m_storage.m_data;
        local_f8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.
        super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
        .m_data = (PointerType)local_d0._8_8_;
        local_f8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.
        super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
        .m_outerStride.m_value = local_d0._16_8_;
        SVar5 = Eigen::internal::
                redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>,3,0>
                ::
                run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>>
                          (&local_f8,(scalar_sum_op<double,_double> *)&local_138,
                           (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                            *)local_d0);
        uVar13 = SUB84(SVar5,0);
        uVar14 = (undefined4)((ulong)SVar5 >> 0x20);
        lVar12 = in_ST5;
      }
      dVar15 = local_148.m_storage.m_data[(long)pdVar9] - (double)CONCAT44(uVar14,uVar13);
      local_148.m_storage.m_data[(long)pdVar9] = dVar15;
      dVar15 = dVar15 / this->sumAll;
      local_148.m_storage.m_data[(long)pdVar9] = dVar15;
      dVar16 = (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data[(long)pdVar9];
      pZVar6 = (Z *)((double)this->d *
                     ((dVar16 * dVar16) / local_118.m_storage.m_data[(long)pdVar9] + -1.0) + 1.0);
      in_ST5 = lVar12;
      if ((1.0 <= (double)pZVar6) && (0.0 < dVar15)) {
        local_f8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d._0_8_ = pZVar6;
        if ((undefined1 *)0xffffffffffffe <
            (undefined1 *)
            ((long)&pZVar6[-1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage + 0xfU) &&
            ((long)pZVar6 < 0 ||
            0x3fe < (uint)((ulong)((long)ABS((double)pZVar6) + -0x10000000000000) >> 0x35))) {
          boost::math::policies::detail::raise_error<std::domain_error,double>
                    ("boost::math::chi_squared_distribution<%1%>::chi_squared_distribution",
                     "Degrees of freedom argument is %1%, but must be > 0 !",(double *)&local_f8);
        }
        pmessage = "Degrees of freedom argument is %1%, but must be > 0 !";
        val = (double *)local_d0;
        local_d0._0_8_ =
             local_f8.
             super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
             .
             super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
             .m_d._0_8_;
        if ((undefined1 *)
            ((long)&(((X *)(local_f8.
                            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                            .
                            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                            .m_d._0_8_ + -0x10))->
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage + 0xfU
            ) < (undefined1 *)0xfffffffffffff ||
            -1 < (long)local_f8.
                       super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                       .
                       super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                       .m_d._0_8_ &&
            (uint)((local_f8.
                    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                    .
                    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                    .m_d._0_8_ & 0x7fffffffffffffff) + 0xfff0000000000000 >> 0x35) < 0x3ff) {
          dVar16 = *(double *)((long)local_148.m_storage.m_data + lVar11);
          if ((uint)((ulong)((long)ABS(dVar16) + -0x10000000000000) >> 0x35) < 0x3ff &&
              -1 < (long)dVar16 || (ABS(dVar16) == 0.0 || (long)dVar16 - 1U < 0xfffffffffffff)) {
            local_38 = (double)local_f8.
                               super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                               .
                               super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                               .m_d._0_8_ * 0.5;
            local_40 = dVar16 * 0.5;
            in_ST5 = lVar12;
            boost::math::detail::
            gamma_incomplete_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x1,(detail *)0x0,(longdouble)local_38,(longdouble)local_40,
                       SUB81(&local_138,0),false,in_R8,in_R9);
            local_168 = in_ST0;
            if (local_128 < ABS(in_ST0)) {
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("gamma_p<%1%>(%1%, %1%)","numeric overflow");
            }
            local_48 = (double)local_168;
            in_ST0 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = lVar12;
            if (local_158 <= local_48) {
              *local_150 = (int)pdVar9;
              local_158 = local_48;
            }
            goto LAB_0014c0b1;
          }
          val = (double *)((long)local_148.m_storage.m_data + lVar11);
          pmessage = "Chi Square parameter was %1%, but must be > 0 !";
        }
        boost::math::policies::detail::raise_error<std::domain_error,double>
                  (boost::math::
                   cdf<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>(boost::math::chi_squared_distribution<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>const&,double_const&)
                   ::function,pmessage,val);
        in_ST5 = lVar12;
      }
LAB_0014c0b1:
      pdVar9 = (double *)((long)pdVar9 + 1);
      lVar10 = lVar10 + 0x10;
      lVar11 = lVar11 + 8;
    } while ((long)pdVar9 < (long)this->nInvSolFound);
  }
  dVar16 = (this->param).multiValuedSignificance;
  uVar13 = SUB84(dVar16,0);
  uVar14 = (undefined4)((ulong)dVar16 >> 0x20);
  if (dVar16 < local_158) {
    local_138.data = (double *)0x0;
    lStack_130 = 0;
    local_58 = dVar16;
    if (0 < this->M) {
      local_168 = (longdouble)CONCAT28(local_168._8_2_,0xbff0000000000000);
      lVar10 = 0;
      lVar11 = 0;
      do {
        iVar1 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar11];
        if (iVar1 == *local_150) {
          local_d0._0_8_ =
               (long)&(((this->iInvRj).
                        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                      m_data + lVar10;
          local_d0._8_8_ =
               (this->invPredictions).
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar1;
          local_b8.m_value =
               (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
          local_a0.m_value =
               (long)((this->invRzj).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data + local_b8.m_value * lVar11);
          local_a8.m_other = 2.0;
          local_80.m_value = 0;
          local_98.m_value = local_b8.m_value;
          local_88 = &this->invRzj;
          local_78.m_value = lVar11;
          local_70 = (void *)local_b8.m_value;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>const>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)&local_138,
                     (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                      *)local_d0,(assign_op<double,_double> *)&local_f8);
          dVar16 = (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data[lVar11];
          local_f8.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d._0_8_ = (this->invPredictions).
                       super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + *local_150;
          if (lStack_130 == 0) {
            uVar13 = 0;
            uVar14 = 0;
            local_f8.
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)&local_138;
          }
          else {
            local_128 = (longdouble)CONCAT28(local_128._8_2_,dVar16);
            local_d0._8_8_ =
                 (((Z *)local_f8.
                        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                        .
                        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                        .m_d._0_8_)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 .m_storage.m_data;
            local_d0._16_8_ = local_138.data;
            local_f8.
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)&local_138;
            SVar7 = Eigen::internal::
                    redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                    ::
                    run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                              ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                *)local_d0,&local_169,
                               (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                *)&local_f8);
            uVar13 = SUB84(SVar7,0);
            uVar14 = (undefined4)((ulong)SVar7 >> 0x20);
            dVar16 = local_128._0_8_;
          }
          dVar16 = dVar16 + (double)CONCAT44(uVar14,uVar13);
          if (local_168._0_8_ < dVar16) {
            *local_100 = (int)lVar11;
            local_168 = (longdouble)CONCAT28(local_168._8_2_,dVar16);
          }
        }
        piVar8 = local_100;
        lVar11 = lVar11 + 1;
        lVar10 = lVar10 + 0x18;
      } while (lVar11 < this->M);
      if (0 < this->M) {
        local_168 = (longdouble)CONCAT28(local_168._8_2_,0xbff0000000000000);
        lVar10 = 0;
        lVar11 = 0;
        do {
          if ((this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11] == *local_150) {
            local_d0._0_8_ =
                 (long)&(((this->iInvRj).
                          super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                        m_data + lVar10;
            local_d0._8_8_ =
                 &(this->experts).
                  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  .
                  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  ._M_impl.super__Vector_impl_data._M_start[*piVar8].super_LinearExpert.pred_z;
            local_b8.m_value =
                 (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
            local_a0.m_value =
                 (long)((this->invRzj).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_data + local_b8.m_value * lVar11);
            local_a8.m_other = 2.0;
            local_80.m_value = 0;
            local_98.m_value = local_b8.m_value;
            local_88 = &this->invRzj;
            local_78.m_value = lVar11;
            local_70 = (void *)local_b8.m_value;
            Eigen::internal::
            call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>const>,Eigen::internal::assign_op<double,double>>
                      ((Matrix<double,__1,_1,_0,__1,_1> *)&local_138,
                       (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                        *)local_d0,(assign_op<double,_double> *)&local_f8);
            dVar16 = (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data[lVar11];
            local_f8.
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_d._0_8_ = &(this->experts).
                          super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                          .
                          super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                          ._M_impl.super__Vector_impl_data._M_start[*piVar8].super_LinearExpert.
                          pred_z;
            if (lStack_130 == 0) {
              uVar13 = 0;
              uVar14 = 0;
              local_f8.
              super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
              .
              super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
              data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                     (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)&local_138;
            }
            else {
              local_128 = (longdouble)CONCAT28(local_128._8_2_,dVar16);
              local_d0._8_8_ =
                   (((Z *)local_f8.
                          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                          .
                          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                          .m_d._0_8_)->
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
              local_d0._16_8_ = local_138.data;
              local_f8.
              super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
              .
              super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
              data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                     (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)&local_138;
              SVar7 = Eigen::internal::
                      redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                      ::
                      run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  *)local_d0,&local_169,
                                 (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                  *)&local_f8);
              uVar13 = SUB84(SVar7,0);
              uVar14 = (undefined4)((ulong)SVar7 >> 0x20);
              dVar16 = local_128._0_8_;
            }
            dVar16 = dVar16 + (double)CONCAT44(uVar14,uVar13);
            if (local_168._0_8_ < dVar16) {
              *local_50 = (int)lVar11;
              local_168 = (longdouble)CONCAT28(local_168._8_2_,dVar16);
            }
          }
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + 0x18;
        } while (lVar11 < this->M);
      }
    }
    free(local_138.data);
    uVar13 = SUB84(local_58,0);
    uVar14 = (undefined4)((ulong)local_58 >> 0x20);
  }
  bVar4 = local_158 <= (double)CONCAT44(uVar14,uVar13);
  free(local_118.m_storage.m_data);
  free(local_148.m_storage.m_data);
  return bVar4;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::validInverseSolutions(int &newSol1, int &newSol2, int &worseSol)
{
    Vec T = Vec::Zero(nInvSolFound);
    Vec sumWsq = Vec::Zero(nInvSolFound);
    for(int j = 0; j < M; j++)
    {
        T(sNearestInv[j]) += zInvRzj(j);
        sumWsq(sNearestInv[j]) += experts[j].get_p_x()*experts[j].get_p_x();
    }

    worseSol = -1;
    Scal max_p_value = -1.0, p_value;
    for(int k = 0; k < nInvSolFound; k++)
    {
        T(k) -= invPredictions[k].dot( sumInvRzj.col(k) );
        T(k) /= (sumAll);

        Scal dof = (sum_p_x(k) * sum_p_x(k) / sumWsq(k) - 1.0) * d;
//        Scal dof = (sum_p_x(k) * sum_p_x(k) / sumWsq(k)) * d;

        // Small hack to prevent numerical problems
        dof += 1.0;
        if( !(dof >= 1.0) || T(k) <= 0.0)  // The negation is because of NaN problems
            continue;
//            dof = 1.0;

        if( ( p_value = cdf(boost::math::chi_squared(dof), T(k)) ) >= max_p_value )
        {
            max_p_value = p_value;
            worseSol = k;
        }
    }

    if( max_p_value <= param.multiValuedSignificance )
        return true;
    else
    {
        // Find the largest expert deviation in worse solution
        Scal dist, dMax = -1.0;
        Z aux;
        for(int j = 0; j < M; j++)
        {
            if (sNearestInv[j] != worseSol)
                continue;

            aux = iInvRj[j] * invPredictions[worseSol] - 2.0 * invRzj.col(j);
            dist = zInvRzj(j) + invPredictions[worseSol].dot( aux );

            if( dist > dMax )
            {
                dMax = dist;
                newSol1 = j;
            }
        }

        // Find the largest expert deviation to newSol1
        dMax = -1.0;
        for(int j = 0; j < M; j++)
        {
            if (sNearestInv[j] != worseSol)
                continue;

            aux = iInvRj[j] * experts[newSol1].getPredZ() - 2.0 * invRzj.col(j);
            dist = zInvRzj(j) + experts[newSol1].getPredZ().dot( aux );

            if( dist > dMax )
            {
                dMax = dist;
                newSol2 = j;
            }
        }

        return false;
    }
}